

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

void __thiscall
kj::MainBuilder::MainImpl::operator()
          (MainImpl *this,StringPtr programName,ArrayPtr<const_kj::StringPtr> params)

{
  Impl *pIVar1;
  _Base_ptr p_Var2;
  Arg *params_1;
  Iface *pIVar3;
  StringPtr programName_00;
  StringPtr programName_01;
  StringPtr programName_02;
  StringPtr programName_03;
  StringPtr programName_04;
  StringPtr programName_05;
  StringPtr programName_06;
  StringPtr programName_07;
  StringPtr programName_08;
  StringPtr programName_09;
  StringPtr programName_10;
  StringPtr programName_11;
  StringPtr programName_12;
  StringPtr programName_13;
  StringPtr programName_14;
  StringPtr programName_15;
  StringPtr programName_16;
  StringPtr programName_17;
  StringPtr programName_18;
  StringPtr programName_19;
  StringPtr programName_20;
  MainImpl *pMVar4;
  bool bVar5;
  int iVar6;
  Arg *argSpec;
  iterator iVar7;
  iterator iVar8;
  Arg *pAVar9;
  iterator iVar10;
  StringPtr *pSVar12;
  ulong uVar13;
  size_t sVar14;
  _Rb_tree_header *p_Var15;
  undefined8 uVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  char *pcVar20;
  ProcessContext *pPVar21;
  char *pcVar22;
  String *in_R9;
  uint uVar23;
  StringPtr *pSVar24;
  Arg *params_00;
  ArrayPtr<const_char> *this_00;
  kj *this_01;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  StringPtr message_04;
  StringPtr message_05;
  StringPtr message_06;
  StringPtr message_07;
  StringPtr message_08;
  StringPtr message_09;
  StringPtr message_10;
  StringPtr message_11;
  StringPtr message_12;
  StringPtr message_13;
  StringPtr message_14;
  StringPtr message_15;
  StringPtr message_16;
  StringPtr message_17;
  String *in_stack_fffffffffffffed8;
  String *in_stack_fffffffffffffee0;
  char c;
  MainImpl *local_110;
  NullableValue<kj::String> _error433;
  MainFunc subMain;
  undefined8 uStack_d8;
  StringPtr programName_local;
  ulong local_b8;
  StringPtr param;
  StringPtr dummyArg;
  StringPtr arg;
  Vector<kj::StringPtr> arguments;
  char *local_40;
  long local_38;
  _func_int **pp_Var11;
  
  pcVar22 = (char *)params.size_;
  pSVar12 = params.ptr;
  programName_local.content.size_ = programName.content.size_;
  programName_local.content.ptr = programName.content.ptr;
  arguments.builder.ptr = (StringPtr *)0x0;
  arguments.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
  arguments.builder.endPtr = (StringPtr *)0x0;
  arguments.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  pcVar19 = (char *)0x0;
  pcVar20 = pcVar22;
  local_110 = this;
  do {
    if (pcVar22 <= pcVar19) {
LAB_00197063:
      pIVar1 = (this->impl).ptr;
      if ((pIVar1->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        programName_13.content.size_ = programName_local.content.size_;
        programName_13.content.ptr = programName_local.content.ptr;
        message_04.content.size_ = 0x10;
        message_04.content.ptr = "missing command";
        usageError(local_110,programName_13,message_04);
      }
      params_00 = (pIVar1->args).builder.ptr;
      params_1 = (pIVar1->args).builder.pos;
      local_b8 = 0;
      for (pAVar9 = params_00; pAVar9 != params_1; pAVar9 = pAVar9 + 1) {
        local_b8 = (ulong)((int)local_b8 + pAVar9->minCount);
      }
      this_01 = (kj *)arguments.builder.ptr;
      for (; params_00 != params_1; params_00 = params_00 + 1) {
        lVar18 = -(long)this_01;
        pAVar9 = params_1;
        for (uVar23 = 0; uVar23 < params_00->minCount; uVar23 = uVar23 + 1) {
          if (this_01 == (kj *)arguments.builder.pos) {
            programName_02.content.size_ = programName_local.content.size_;
            programName_02.content.ptr = programName_local.content.ptr;
            str<char_const(&)[18],kj::StringPtr&>
                      ((String *)&_error433,(kj *)"missing argument ",(char (*) [18])params_00,
                       &pAVar9->title);
            pcVar20 = (char *)_error433._0_8_;
            if (_error433.field_1.value.content.ptr == (char *)0x0) {
              pcVar20 = "";
            }
            message_00.content.size_ =
                 _error433.field_1.value.content.ptr +
                 (_error433.field_1.value.content.ptr == (char *)0x0);
            message_00.content.ptr = pcVar20;
            usageError(local_110,programName_02,message_00);
          }
          pAVar9 = *(Arg **)(this_01 + 8);
          pIVar3 = (params_00->callback).impl.ptr;
          (**pIVar3->_vptr_Iface)
                    ((NullableValue<kj::String> *)&dummyArg,pIVar3,*(undefined8 *)this_01);
          Maybe<kj::String>::Maybe((Maybe<kj::String> *)&subMain,(Maybe<kj::String> *)&dummyArg);
          _error433.isSet = (bool)subMain.impl.disposer._0_1_;
          if ((bool)subMain.impl.disposer._0_1_ == true) {
            _error433.field_1.value.content.ptr = (char *)subMain.impl.ptr;
            _error433.field_1.value.content.size_ = uStack_d8;
            subMain.impl.ptr = (Iface *)0x0;
            uStack_d8 = 0;
          }
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
          if (_error433.isSet == true) {
            programName_01.content.size_ = programName_local.content.size_;
            programName_01.content.ptr = programName_local.content.ptr;
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      ((String *)&subMain,this_01,(StringPtr *)0x1bda2f,
                       (char (*) [3])&_error433.field_1,(String *)pcVar20);
            if (subMain.impl.ptr == (Iface *)0x0) {
              subMain.impl.disposer = (Disposer *)0x1bf653;
            }
            message.content.size_ =
                 (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
            message.content.ptr = (char *)subMain.impl.disposer;
            usageError(local_110,programName_01,message);
          }
          kj::_::NullableValue<kj::String>::~NullableValue(&_error433);
          this_01 = this_01 + 0x10;
          lVar18 = lVar18 + -0x10;
        }
        local_b8 = (ulong)((int)local_b8 - uVar23);
        for (; (uVar23 < params_00->maxCount &&
               ((long)local_b8 < (long)&((arguments.builder.pos)->content).ptr + lVar18 >> 4));
            lVar18 = lVar18 + -0x10) {
          pIVar3 = (params_00->callback).impl.ptr;
          (**pIVar3->_vptr_Iface)
                    ((NullableValue<kj::String> *)&dummyArg,pIVar3,*(undefined8 *)this_01,
                     *(undefined8 *)(this_01 + 8));
          Maybe<kj::String>::Maybe((Maybe<kj::String> *)&subMain,(Maybe<kj::String> *)&dummyArg);
          _error433.isSet = (bool)subMain.impl.disposer._0_1_;
          if ((bool)subMain.impl.disposer._0_1_ == true) {
            _error433.field_1.value.content.ptr = (char *)subMain.impl.ptr;
            _error433.field_1.value.content.size_ = uStack_d8;
            subMain.impl.ptr = (Iface *)0x0;
            uStack_d8 = 0;
          }
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
          if (_error433.isSet == true) {
            programName_03.content.size_ = programName_local.content.size_;
            programName_03.content.ptr = programName_local.content.ptr;
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      ((String *)&subMain,this_01,(StringPtr *)0x1bda2f,
                       (char (*) [3])&_error433.field_1,(String *)pcVar20);
            if (subMain.impl.ptr == (Iface *)0x0) {
              subMain.impl.disposer = (Disposer *)0x1bf653;
            }
            message_01.content.size_ =
                 (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
            message_01.content.ptr = (char *)subMain.impl.disposer;
            usageError(local_110,programName_03,message_01);
          }
          kj::_::NullableValue<kj::String>::~NullableValue(&_error433);
          this_01 = this_01 + 0x10;
          uVar23 = uVar23 + 1;
        }
      }
      if (this_01 < arguments.builder.pos) {
        programName_14.content.size_ = programName_local.content.size_;
        programName_14.content.ptr = programName_local.content.ptr;
        str<kj::StringPtr&,char_const(&)[21]>
                  ((String *)&_error433,this_01,(StringPtr *)": too many arguments",
                   (char (*) [21])params_1);
        pcVar20 = (char *)_error433._0_8_;
        if (_error433.field_1.value.content.ptr == (char *)0x0) {
          pcVar20 = "";
        }
        message_11.content.size_ =
             _error433.field_1.value.content.ptr +
             (_error433.field_1.value.content.ptr == (char *)0x0);
        message_11.content.ptr = pcVar20;
        usageError(local_110,programName_14,message_11);
      }
      pIVar1 = (local_110->impl).ptr;
      if ((pIVar1->finalCallback).ptr.isSet == true) {
        (**((pIVar1->finalCallback).ptr.field_1.value.impl.ptr)->_vptr_Iface)(&dummyArg);
        Maybe<kj::String>::Maybe((Maybe<kj::String> *)&subMain,(Maybe<kj::String> *)&dummyArg);
        _error433.isSet = (bool)subMain.impl.disposer._0_1_;
        if ((bool)subMain.impl.disposer._0_1_ == true) {
          _error433.field_1.value.content.ptr = (char *)subMain.impl.ptr;
          _error433.field_1.value.content.size_ = uStack_d8;
          subMain.impl.ptr = (Iface *)0x0;
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
          programName_16.content.size_ = programName_local.content.size_;
          programName_16.content.ptr = programName_local.content.ptr;
          uVar16 = _error433.field_1.value.content.ptr;
          if (_error433.field_1.value.content.size_ == 0) {
            uVar16 = "";
          }
          message_12.content.size_ =
               _error433.field_1.value.content.size_ + (_error433.field_1.value.content.size_ == 0);
          message_12.content.ptr = (char *)uVar16;
          usageError(local_110,programName_16,message_12);
        }
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
        kj::_::NullableValue<kj::String>::~NullableValue(&_error433);
      }
LAB_00197299:
      ArrayBuilder<kj::StringPtr>::dispose(&arguments.builder);
      return;
    }
    param.content.ptr = pSVar12[(long)pcVar19].content.ptr;
    param.content.size_ = pSVar12[(long)pcVar19].content.size_;
    _error433._0_8_ = anon_var_dwarf_2d389c;
    _error433.field_1.value.content.ptr = (char *)0x3;
    bVar5 = ArrayPtr<const_char>::operator==(&param.content,(ArrayPtr<const_char> *)&_error433);
    if (bVar5) {
      Vector<kj::StringPtr>::addAll<kj::StringPtr_const*>
                (&arguments,pSVar12 + (long)(pcVar19 + 1),pSVar12 + (long)pcVar22);
      this = local_110;
      goto LAB_00197063;
    }
    _error433._0_8_ = anon_var_dwarf_2d389c;
    _error433.field_1.value.content.ptr = (char *)0x3;
    bVar5 = StringPtr::startsWith((StringPtr *)&param.content,(StringPtr *)&_error433);
    this = local_110;
    if (bVar5) {
      arg.content.ptr = (char *)0x0;
      arg.content.size_ = 0;
      StringPtr::findFirst((StringPtr *)&_error433,(char)&param.content);
      bVar5 = _error433.isSet;
      if (_error433.isSet == true) {
        arg.content.size_ = (size_t)(_error433.field_1.value.content.ptr + -2);
        local_38 = param.content.size_ - (long)(_error433.field_1.value.content.ptr + 1);
        local_40 = _error433.field_1.value.content.ptr + (long)param.content.ptr + 1;
      }
      else {
        arg.content.size_ = param.content.size_ - 3;
      }
      arg.content.ptr = param.content.ptr + 2;
      iVar8 = std::
              _Rb_tree<kj::ArrayPtr<const_char>,_std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_std::less<kj::ArrayPtr<const_char>_>,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
              ::find(&(((this->impl).ptr)->longOptions)._M_t,&arg.content);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &(((this->impl).ptr)->longOptions)._M_t._M_impl.super__Rb_tree_header) {
        _error433._0_8_ = anon_var_dwarf_2d38b3;
        _error433.field_1.value.content.ptr = (char *)0x7;
        bVar5 = ArrayPtr<const_char>::operator==(&param.content,(ArrayPtr<const_char> *)&_error433);
        programName_07.content.size_ = programName_local.content.size_;
        programName_07.content.ptr = programName_local.content.ptr;
        programName_06.content.size_ = programName_local.content.size_;
        programName_06.content.ptr = programName_local.content.ptr;
        if (!bVar5) {
          str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[22]>
                    ((String *)&_error433,(kj *)"--",(char (*) [3])&arg,
                     (ArrayPtr<const_char> *)": unrecognized option",(char (*) [22])pcVar20);
          pcVar20 = (char *)_error433._0_8_;
          if (_error433.field_1.value.content.ptr == (char *)0x0) {
            pcVar20 = "";
          }
          message_07.content.size_ =
               _error433.field_1.value.content.ptr +
               (_error433.field_1.value.content.ptr == (char *)0x0);
          message_07.content.ptr = pcVar20;
          usageError(local_110,programName_07,message_07);
        }
        printHelp(local_110,programName_06);
      }
      p_Var2 = iVar8._M_node[1]._M_left;
      if (*(char *)&p_Var2->_M_left == '\x01') {
        if (bVar5 == false) {
          if (pcVar22 <= pcVar19 + 1) {
LAB_0019771a:
            programName_10.content.size_ = programName_local.content.size_;
            programName_10.content.ptr = programName_local.content.ptr;
            str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[19]>
                      ((String *)&_error433,(kj *)"--",(char (*) [3])&arg,
                       (ArrayPtr<const_char> *)": missing argument",(char (*) [19])pcVar20);
            pcVar20 = (char *)_error433._0_8_;
            if (_error433.field_1.value.content.ptr == (char *)0x0) {
              pcVar20 = "";
            }
            message_08.content.size_ =
                 _error433.field_1.value.content.ptr +
                 (_error433.field_1.value.content.ptr == (char *)0x0);
            message_08.content.ptr = pcVar20;
            usageError(local_110,programName_10,message_08);
          }
          pSVar24 = pSVar12 + (long)(pcVar19 + 1);
          _error433._0_8_ = (long)"--" + 1;
          _error433.field_1.value.content.ptr = (char *)0x2;
          bVar5 = StringPtr::startsWith(pSVar24,(StringPtr *)&_error433);
          if (bVar5) {
            sVar14 = (pSVar24->content).size_;
            if (1 < sVar14 - 1) goto LAB_0019771a;
          }
          else {
            sVar14 = (pSVar24->content).size_;
          }
          p_Var2 = p_Var2->_M_right->_M_parent;
          (*(code *)**(undefined8 **)p_Var2)
                    ((Maybe<kj::String> *)&dummyArg,p_Var2,(pSVar24->content).ptr,sVar14);
          Maybe<kj::String>::Maybe((Maybe<kj::String> *)&subMain,(Maybe<kj::String> *)&dummyArg);
          _error433.isSet = (bool)subMain.impl.disposer._0_1_;
          if ((bool)subMain.impl.disposer._0_1_ == true) {
            _error433.field_1.value.content.ptr = (char *)subMain.impl.ptr;
            _error433.field_1.value.content.size_ = uStack_d8;
            subMain.impl.ptr = (Iface *)0x0;
            uStack_d8 = 0;
          }
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
          if (_error433.isSet == true) {
            programName_11.content.size_ = programName_local.content.size_;
            programName_11.content.ptr = programName_local.content.ptr;
            str<kj::StringPtr&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                      ((String *)&subMain,(kj *)&param,(StringPtr *)"=",(char (*) [2])pSVar24,
                       (StringPtr *)0x1bda2f,(char (*) [3])&_error433.field_1,
                       in_stack_fffffffffffffed8);
            if (subMain.impl.ptr == (Iface *)0x0) {
              subMain.impl.disposer = (Disposer *)0x1bf653;
            }
            message_09.content.size_ =
                 (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
            message_09.content.ptr = (char *)subMain.impl.disposer;
            usageError(local_110,programName_11,message_09);
          }
LAB_00196e4b:
          pcVar19 = pcVar19 + 1;
          kj::_::NullableValue<kj::String>::~NullableValue(&_error433);
          this = local_110;
          goto LAB_00196e58;
        }
        p_Var2 = p_Var2->_M_right->_M_parent;
        (*(code *)**(undefined8 **)p_Var2)((Maybe<kj::String> *)&dummyArg,p_Var2,local_40,local_38);
        Maybe<kj::String>::Maybe((Maybe<kj::String> *)&subMain,(Maybe<kj::String> *)&dummyArg);
        _error433.isSet = (bool)subMain.impl.disposer._0_1_;
        if ((bool)subMain.impl.disposer._0_1_ == true) {
          _error433.field_1.value.content.ptr = (char *)subMain.impl.ptr;
          _error433.field_1.value.content.size_ = uStack_d8;
          subMain.impl.ptr = (Iface *)0x0;
          uStack_d8 = 0;
        }
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
        if (_error433.isSet == true) {
          programName_12.content.size_ = programName_local.content.size_;
          programName_12.content.ptr = programName_local.content.ptr;
          str<kj::StringPtr&,char_const(&)[3],kj::String&>
                    ((String *)&subMain,(kj *)&param,(StringPtr *)0x1bda2f,
                     (char (*) [3])&_error433.field_1,(String *)pcVar20);
          if (subMain.impl.ptr == (Iface *)0x0) {
            subMain.impl.disposer = (Disposer *)0x1bf653;
          }
          message_10.content.size_ =
               (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
          message_10.content.ptr = (char *)subMain.impl.disposer;
          usageError(local_110,programName_12,message_10);
        }
      }
      else {
        if (bVar5 != false) {
          programName_09.content.size_ = programName_local.content.size_;
          programName_09.content.ptr = programName_local.content.ptr;
          str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[37]>
                    ((String *)&_error433,(kj *)"--",(char (*) [3])&arg,
                     (ArrayPtr<const_char> *)": option does not accept an argument",
                     (char (*) [37])pcVar20);
          pcVar20 = (char *)_error433._0_8_;
          if (_error433.field_1.value.content.ptr == (char *)0x0) {
            pcVar20 = "";
          }
          message_06.content.size_ =
               _error433.field_1.value.content.ptr +
               (_error433.field_1.value.content.ptr == (char *)0x0);
          message_06.content.ptr = pcVar20;
          usageError(local_110,programName_09,message_06);
        }
        (*(code *)**(undefined8 **)p_Var2->_M_right->_M_parent)((Maybe<kj::String> *)&dummyArg);
        Maybe<kj::String>::Maybe((Maybe<kj::String> *)&subMain,(Maybe<kj::String> *)&dummyArg);
        _error433.isSet = (bool)subMain.impl.disposer._0_1_;
        if ((bool)subMain.impl.disposer._0_1_ == true) {
          _error433.field_1.value.content.ptr = (char *)subMain.impl.ptr;
          _error433.field_1.value.content.size_ = uStack_d8;
          subMain.impl.ptr = (Iface *)0x0;
          uStack_d8 = 0;
        }
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
        if (_error433.isSet == true) {
          programName_08.content.size_ = programName_local.content.size_;
          programName_08.content.ptr = programName_local.content.ptr;
          str<kj::StringPtr&,char_const(&)[3],kj::String&>
                    ((String *)&subMain,(kj *)&param,(StringPtr *)0x1bda2f,
                     (char (*) [3])&_error433.field_1,(String *)pcVar20);
          if (subMain.impl.ptr == (Iface *)0x0) {
            subMain.impl.disposer = (Disposer *)0x1bf653;
          }
          message_05.content.size_ =
               (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
          message_05.content.ptr = (char *)subMain.impl.disposer;
          usageError(local_110,programName_08,message_05);
        }
      }
LAB_00196d6d:
      kj::_::NullableValue<kj::String>::~NullableValue(&_error433);
    }
    else {
      _error433._0_8_ = (long)"--" + 1;
      _error433.field_1.value.content.ptr = (char *)0x2;
      bVar5 = StringPtr::startsWith((StringPtr *)&param.content,(StringPtr *)&_error433);
      if ((bVar5) && (param.content.size_ - 3 < 0xfffffffffffffffe)) {
        uVar17 = 2;
        while( true ) {
          uVar13 = (ulong)((int)uVar17 - 1);
          if (param.content.size_ - 1 <= uVar13) break;
          c = param.content.ptr[uVar13];
          iVar7 = std::
                  _Rb_tree<char,_std::pair<const_char,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
                  ::find(&(((this->impl).ptr)->shortOptions)._M_t,&c);
          if ((_Rb_tree_header *)iVar7._M_node ==
              &(((this->impl).ptr)->shortOptions)._M_t._M_impl.super__Rb_tree_header) {
            programName_04.content.size_ = programName_local.content.size_;
            programName_04.content.ptr = programName_local.content.ptr;
            str<char_const(&)[2],char&,char_const(&)[22]>
                      ((String *)&_error433,(kj *)0x1bf464,(char (*) [2])&c,": unrecognized option",
                       (char (*) [22])pcVar20);
            pcVar20 = (char *)_error433._0_8_;
            if (_error433.field_1.value.content.ptr == (char *)0x0) {
              pcVar20 = "";
            }
            message_02.content.size_ =
                 _error433.field_1.value.content.ptr +
                 (_error433.field_1.value.content.ptr == (char *)0x0);
            message_02.content.ptr = pcVar20;
            usageError(local_110,programName_04,message_02);
          }
          p_Var2 = iVar7._M_node[1]._M_parent;
          if (*(char *)&p_Var2->_M_left == '\x01') {
            if (uVar17 < param.content.size_ - 1) {
              arg.content.size_ = param.content.size_ - uVar17;
              arg.content.ptr = param.content.ptr + uVar17;
              (*(code *)**(undefined8 **)p_Var2->_M_right->_M_parent)
                        ((Maybe<kj::String> *)&dummyArg);
              Maybe<kj::String>::Maybe((Maybe<kj::String> *)&subMain,(Maybe<kj::String> *)&dummyArg)
              ;
              _error433.isSet = (bool)subMain.impl.disposer._0_1_;
              if ((bool)subMain.impl.disposer._0_1_ == true) {
                _error433.field_1.value.content.ptr = (char *)subMain.impl.ptr;
                _error433.field_1.value.content.size_ = uStack_d8;
                subMain.impl.ptr = (Iface *)0x0;
                uStack_d8 = 0;
              }
              kj::_::NullableValue<kj::String>::~NullableValue
                        ((NullableValue<kj::String> *)&subMain);
              kj::_::NullableValue<kj::String>::~NullableValue
                        ((NullableValue<kj::String> *)&dummyArg);
              if (_error433.isSet == true) {
                programName_17.content.size_ = programName_local.content.size_;
                programName_17.content.ptr = programName_local.content.ptr;
                str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr&,char_const(&)[3],kj::String&>
                          ((String *)&subMain,(kj *)0x1bf464,(char (*) [2])&c," ",(char (*) [2])&arg
                           ,(StringPtr *)0x1bda2f,(char (*) [3])&_error433.field_1,
                           in_stack_fffffffffffffee0);
                if (subMain.impl.ptr == (Iface *)0x0) {
                  subMain.impl.disposer = (Disposer *)0x1bf653;
                }
                message_15.content.size_ =
                     (long)&(subMain.impl.ptr)->_vptr_Iface +
                     (ulong)(subMain.impl.ptr == (Iface *)0x0);
                message_15.content.ptr = (char *)subMain.impl.disposer;
                usageError(local_110,programName_17,message_15);
              }
              goto LAB_00196d6d;
            }
            if (pcVar22 <= pcVar19 + 1) {
LAB_001978b7:
              programName_15.content.size_ = programName_local.content.size_;
              programName_15.content.ptr = programName_local.content.ptr;
              str<char_const(&)[2],char&,char_const(&)[19]>
                        ((String *)&_error433,(kj *)0x1bf464,(char (*) [2])&c,": missing argument",
                         (char (*) [19])pcVar20);
              pcVar20 = (char *)_error433._0_8_;
              if (_error433.field_1.value.content.ptr == (char *)0x0) {
                pcVar20 = "";
              }
              message_13.content.size_ =
                   _error433.field_1.value.content.ptr +
                   (_error433.field_1.value.content.ptr == (char *)0x0);
              message_13.content.ptr = pcVar20;
              usageError(local_110,programName_15,message_13);
            }
            pSVar24 = pSVar12 + (long)(pcVar19 + 1);
            _error433._0_8_ = (long)"--" + 1;
            _error433.field_1.value.content.ptr = (char *)0x2;
            bVar5 = StringPtr::startsWith(pSVar24,(StringPtr *)&_error433);
            if (bVar5) {
              sVar14 = (pSVar24->content).size_;
              if (1 < sVar14 - 1) goto LAB_001978b7;
            }
            else {
              sVar14 = (pSVar24->content).size_;
            }
            p_Var2 = p_Var2->_M_right->_M_parent;
            (*(code *)**(undefined8 **)p_Var2)
                      ((Maybe<kj::String> *)&dummyArg,p_Var2,(pSVar24->content).ptr,sVar14);
            Maybe<kj::String>::Maybe((Maybe<kj::String> *)&subMain,(Maybe<kj::String> *)&dummyArg);
            _error433.isSet = (bool)subMain.impl.disposer._0_1_;
            if ((bool)subMain.impl.disposer._0_1_ == true) {
              _error433.field_1.value.content.ptr = (char *)subMain.impl.ptr;
              _error433.field_1.value.content.size_ = uStack_d8;
              subMain.impl.ptr = (Iface *)0x0;
              uStack_d8 = 0;
            }
            kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
            kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg)
            ;
            if (_error433.isSet == true) {
              programName_00.content.size_ = programName_local.content.size_;
              programName_00.content.ptr = programName_local.content.ptr;
              str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                        ((String *)&subMain,(kj *)0x1bf464,(char (*) [2])&c," ",
                         (char (*) [2])pSVar24,(StringPtr *)0x1bda2f,
                         (char (*) [3])&_error433.field_1,in_stack_fffffffffffffee0);
              if (subMain.impl.ptr == (Iface *)0x0) {
                subMain.impl.disposer = (Disposer *)0x1bf653;
              }
              message_14.content.size_ =
                   (long)&(subMain.impl.ptr)->_vptr_Iface +
                   (ulong)(subMain.impl.ptr == (Iface *)0x0);
              message_14.content.ptr = (char *)subMain.impl.disposer;
              usageError(local_110,programName_00,message_14);
            }
            goto LAB_00196e4b;
          }
          (*(code *)**(undefined8 **)p_Var2->_M_right->_M_parent)((Maybe<kj::String> *)&dummyArg);
          Maybe<kj::String>::Maybe((Maybe<kj::String> *)&subMain,(Maybe<kj::String> *)&dummyArg);
          _error433.isSet = (bool)subMain.impl.disposer._0_1_;
          if ((bool)subMain.impl.disposer._0_1_ == true) {
            _error433.field_1.value.content.ptr = (char *)subMain.impl.ptr;
            _error433.field_1.value.content.size_ = uStack_d8;
            subMain.impl.ptr = (Iface *)0x0;
            uStack_d8 = 0;
          }
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
          if (_error433.isSet == true) {
            programName_05.content.size_ = programName_local.content.size_;
            programName_05.content.ptr = programName_local.content.ptr;
            str<char_const(&)[2],char&,char_const(&)[3],kj::String&>
                      ((String *)&subMain,(kj *)0x1bf464,(char (*) [2])&c,": ",
                       (char (*) [3])&_error433.field_1,in_R9);
            if (subMain.impl.ptr == (Iface *)0x0) {
              subMain.impl.disposer = (Disposer *)0x1bf653;
            }
            message_03.content.size_ =
                 (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
            message_03.content.ptr = (char *)subMain.impl.disposer;
            usageError(local_110,programName_05,message_03);
          }
          kj::_::NullableValue<kj::String>::~NullableValue(&_error433);
          uVar17 = (ulong)((int)uVar17 + 1);
        }
      }
      else {
        pIVar1 = (this->impl).ptr;
        if ((pIVar1->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          iVar10 = std::
                   _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                   ::find(&(pIVar1->subCommands)._M_t,&param);
          p_Var15 = &(((this->impl).ptr)->subCommands)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar10._M_node != p_Var15) {
            (*(code *)**(undefined8 **)iVar10._M_node[1]._M_right)(&subMain);
            dummyArg.content.ptr = (char *)CONCAT71(dummyArg.content.ptr._1_7_,0x20);
            str<kj::StringPtr&,char,kj::StringPtr&>
                      ((String *)&_error433,(kj *)&programName_local,&dummyArg,(char *)&param,
                       (StringPtr *)pcVar20);
            pcVar20 = (char *)_error433._0_8_;
            if (_error433.field_1.value.content.ptr == (char *)0x0) {
              pcVar20 = "";
            }
            (**(subMain.impl.ptr)->_vptr_Iface)
                      (subMain.impl.ptr,pcVar20,
                       _error433.field_1.value.content.ptr +
                       (_error433.field_1.value.content.ptr == (char *)0x0),
                       pSVar12 + (long)(pcVar19 + 1),(long)pcVar22 - (long)(pcVar19 + 1));
            Array<char>::~Array((Array<char> *)&_error433);
            Own<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Iface,_std::nullptr_t>
            ::dispose(&subMain.impl);
            goto LAB_00197299;
          }
          _error433._0_8_ = (long)"--help" + 2;
          _error433.field_1.value.content.ptr = (char *)0x5;
          bVar5 = ArrayPtr<const_char>::operator==
                            (&param.content,(ArrayPtr<const_char> *)&_error433);
          pMVar4 = local_110;
          if (!bVar5) {
            programName_18.content.size_ = programName_local.content.size_;
            programName_18.content.ptr = programName_local.content.ptr;
            str<kj::StringPtr&,char_const(&)[18]>
                      ((String *)&_error433,(kj *)&param,(StringPtr *)": unknown command",
                       (char (*) [18])p_Var15);
            pcVar20 = (char *)_error433._0_8_;
            if (_error433.field_1.value.content.ptr == (char *)0x0) {
              pcVar20 = "";
            }
            message_16.content.size_ =
                 _error433.field_1.value.content.ptr +
                 (_error433.field_1.value.content.ptr == (char *)0x0);
            message_16.content.ptr = pcVar20;
            usageError(local_110,programName_18,message_16);
          }
          if (pcVar22 <= pcVar19 + 1) {
            programName_19.content.size_ = programName_local.content.size_;
            programName_19.content.ptr = programName_local.content.ptr;
            printHelp(local_110,programName_19);
          }
          this_00 = &pSVar12[(long)(pcVar19 + 1)].content;
          iVar10 = std::
                   _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                   ::find(&(((local_110->impl).ptr)->subCommands)._M_t,(key_type *)this_00);
          p_Var15 = &(((pMVar4->impl).ptr)->subCommands)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar10._M_node == p_Var15) {
            _error433._0_8_ = (long)"--help" + 2;
            _error433.field_1.value.content.ptr = (char *)0x5;
            bVar5 = ArrayPtr<const_char>::operator==(this_00,(ArrayPtr<const_char> *)&_error433);
            if (!bVar5) {
              programName_20.content.size_ = programName_local.content.size_;
              programName_20.content.ptr = programName_local.content.ptr;
              str<kj::StringPtr_const&,char_const(&)[18]>
                        ((String *)&_error433,(kj *)this_00,(StringPtr *)": unknown command",
                         (char (*) [18])p_Var15);
              pcVar20 = (char *)_error433._0_8_;
              if (_error433.field_1.value.content.ptr == (char *)0x0) {
                pcVar20 = "";
              }
              message_17.content.size_ =
                   _error433.field_1.value.content.ptr +
                   (_error433.field_1.value.content.ptr == (char *)0x0);
              message_17.content.ptr = pcVar20;
              usageError(local_110,programName_20,message_17);
            }
            uVar23 = 0;
            break;
          }
          (*(code *)**(undefined8 **)iVar10._M_node[1]._M_right)(&subMain);
          dummyArg.content.ptr = "--help";
          dummyArg.content.size_ = 7;
          arg.content.ptr = (char *)CONCAT71(arg.content.ptr._1_7_,0x20);
          str<kj::StringPtr&,char,kj::StringPtr_const&>
                    ((String *)&_error433,(kj *)&programName_local,&arg,(char *)this_00,
                     (StringPtr *)pcVar20);
          pcVar20 = (char *)_error433._0_8_;
          if (_error433.field_1.value.content.ptr == (char *)0x0) {
            pcVar20 = "";
          }
          (**(subMain.impl.ptr)->_vptr_Iface)
                    (subMain.impl.ptr,pcVar20,
                     _error433.field_1.value.content.ptr +
                     (_error433.field_1.value.content.ptr == (char *)0x0),&dummyArg,1);
          Array<char>::~Array((Array<char> *)&_error433);
          Own<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Iface,_std::nullptr_t>
          ::dispose(&subMain.impl);
          goto LAB_00197299;
        }
        Vector<kj::StringPtr>::add<kj::StringPtr&>(&arguments,(StringPtr *)&param.content);
      }
    }
LAB_00196e58:
    pcVar19 = pcVar19 + 1;
  } while( true );
LAB_00197ae1:
  pcVar20 = (char *)(ulong)((int)pcVar19 + 2 + uVar23);
  if (pcVar22 <= pcVar20) {
LAB_00197b6b:
    if (uVar23 == 0) {
      pPVar21 = ((local_110->impl).ptr)->context;
      pp_Var11 = pPVar21->_vptr_ProcessContext + 5;
      uVar16 = 0x27;
      pcVar20 = "Help about help?  We must go deeper...";
    }
    else if (uVar23 == 1) {
      pPVar21 = ((local_110->impl).ptr)->context;
      pp_Var11 = pPVar21->_vptr_ProcessContext + 5;
      uVar16 = 0x6d;
      pcVar20 = 
      "Yo dawg, I heard you like help.  So I wrote you some help about how to use help so you can get help on help."
      ;
    }
    else if (uVar23 == 2) {
      pPVar21 = ((local_110->impl).ptr)->context;
      pp_Var11 = pPVar21->_vptr_ProcessContext + 5;
      uVar16 = 0x2a;
      pcVar20 = "Help, I\'m trapped in a help text factory!";
    }
    else {
      pPVar21 = ((local_110->impl).ptr)->context;
      if (uVar23 < 10) {
        pp_Var11 = pPVar21->_vptr_ProcessContext + 4;
        uVar16 = 0x1f;
        pcVar20 = "Killed by signal 911 (SIGHELP)";
      }
      else {
        pp_Var11 = pPVar21->_vptr_ProcessContext + 5;
        uVar16 = 0x1d;
        pcVar20 = "How to keep an idiot busy...";
      }
    }
    iVar6 = (**pp_Var11)(pPVar21,pcVar20,uVar16);
    Array<char>::~Array((Array<char> *)&_error433);
    ArrayBuilder<kj::StringPtr>::dispose(&arguments.builder);
    _Unwind_Resume(iVar6);
  }
  _error433._0_8_ = (long)"--help" + 2;
  _error433.field_1.value.content.ptr = (char *)0x5;
  bVar5 = ArrayPtr<const_char>::operator==
                    (&pSVar12[(long)pcVar20].content,(ArrayPtr<const_char> *)&_error433);
  if (!bVar5) {
    subMain.impl.disposer = (Disposer *)anon_var_dwarf_2d38b3;
    subMain.impl.ptr = (Iface *)0x7;
    bVar5 = ArrayPtr<const_char>::operator==
                      (&pSVar12[(long)pcVar20].content,(ArrayPtr<const_char> *)&subMain);
    if (!bVar5) goto LAB_00197b6b;
  }
  uVar23 = uVar23 + 1;
  goto LAB_00197ae1;
}

Assistant:

void MainBuilder::MainImpl::operator()(StringPtr programName, ArrayPtr<const StringPtr> params) {
  Vector<StringPtr> arguments;

  for (size_t i = 0; i < params.size(); i++) {
    StringPtr param = params[i];
    if (param == "--") {
      // "--" ends option parsing.
      arguments.addAll(params.begin() + i + 1, params.end());
      break;
    } else if (param.startsWith("--")) {
      // Long option.
      ArrayPtr<const char> name;
      Maybe<StringPtr> maybeArg;
      KJ_IF_SOME(pos, param.findFirst('=')) {
        name = param.slice(2, pos);
        maybeArg = param.slice(pos + 1);
      } else {
        name = param.slice(2);
      }
      auto iter = impl->longOptions.find(name);
      if (iter == impl->longOptions.end()) {
        if (param == "--help") {
          printHelp(programName);
        } else {
          usageError(programName, str("--", name, ": unrecognized option"));
        }
      } else {
        const Impl::Option& option = *iter->second;
        if (option.hasArg) {
          // Argument expected.
          KJ_IF_SOME(arg, maybeArg) {
            // "--foo=blah": "blah" is the argument.
            KJ_IF_SOME(error, (*option.funcWithArg)(arg).releaseError()) {
              usageError(programName, str(param, ": ", error));
            }
          } else if (i + 1 < params.size() &&
                     !(params[i + 1].startsWith("-") && params[i + 1].size() > 1)) {
            // "--foo blah": "blah" is the argument.
            ++i;
            KJ_IF_SOME(error, (*option.funcWithArg)(params[i]).releaseError()) {
              usageError(programName, str(param, "=", params[i], ": ", error));
            }
          } else {
            usageError(programName, str("--", name, ": missing argument"));
          }
        } else {
          // No argument expected.
          if (maybeArg == kj::none) {
            KJ_IF_SOME(error, (*option.func)().releaseError()) {
              usageError(programName, str(param, ": ", error));
            }
          } else {
            usageError(programName, str("--", name, ": option does not accept an argument"));
          }
        }
      }
    }